

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_compress_symbolic.cpp
# Opt level: O1

bool realign_weights_undecimated
               (astcenc_profile decode_mode,block_size_descriptor *bsd,image_block *blk,
               symbolic_compressed_block *scb)

{
  undefined1 auVar1 [16];
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  bool bVar11;
  int iVar12;
  anon_union_32_2_267bb92b_for_symbolic_compressed_block_9 *input;
  uint8_t *puVar13;
  uint pa_idx;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  vint4 *output0;
  vint4 *output1;
  undefined1 auVar17 [16];
  undefined1 in_ZMM2 [64];
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float fVar26;
  float fVar27;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar28;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  bool alpha_hdr;
  bool rgb_hdr;
  vfloat4 offset [4];
  vfloat4 endpnt0f [4];
  vint4 endpnt1 [4];
  vint4 endpnt0 [4];
  bool local_172;
  bool local_171;
  uint local_170;
  astcenc_profile local_16c;
  ulong local_168;
  block_size_descriptor *local_160;
  partition_info *local_158;
  anon_union_32_2_267bb92b_for_symbolic_compressed_block_9 *local_150;
  undefined1 local_148 [16];
  float afStack_138 [16];
  float afStack_f8 [16];
  vint4 local_b8 [4];
  vint4 local_78 [4];
  
  bVar2 = scb->partition_count;
  local_158 = block_size_descriptor::get_partition_info(bsd,(uint)bVar2,(uint)scb->partition_index);
  uVar4 = bsd->block_mode_packed_index[scb->block_mode];
  if ((uVar4 == 0xffff) ||
     (bsd->block_mode_count_all < (uint)uVar4 || bsd->block_mode_count_all == (uint)uVar4)) {
    __assert_fail("packed_index != BLOCK_BAD_BLOCK_MODE && packed_index < this->block_mode_count_all"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_internal.h"
                  ,0x27f,
                  "const block_mode &block_size_descriptor::get_block_mode(unsigned int) const");
  }
  if ((ulong)bVar2 == 0) {
    __assert_fail("partition_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                  ,0x60,
                  "bool realign_weights_undecimated(astcenc_profile, const block_size_descriptor &, const image_block &, symbolic_compressed_block &)"
                 );
  }
  local_168 = (ulong)bsd->block_modes[uVar4].quant_mode;
  local_170 = (byte)bsd->block_modes[uVar4].field_0x5 & 1;
  iVar12 = (int)scb->plane2_component;
  auVar17._4_4_ = iVar12;
  auVar17._0_4_ = iVar12;
  auVar17._8_4_ = iVar12;
  auVar17._12_4_ = iVar12;
  local_148 = vpcmpeqd_avx(auVar17,_DAT_0027d3d0);
  input = &scb->field_9;
  output0 = local_78;
  output1 = local_b8;
  uVar14 = 0;
  local_16c = decode_mode;
  local_160 = bsd;
  do {
    local_150 = input;
    unpack_color_endpoints
              (local_16c,(uint)scb->color_formats[uVar14],(uint8_t *)input->constant_color,
               &local_171,&local_172,output0,output1);
    uVar14 = uVar14 + 1;
    input = (anon_union_32_2_267bb92b_for_symbolic_compressed_block_9 *)
            (local_150->constant_color + 2);
    output0 = output0 + 1;
    output1 = output1 + 1;
  } while (bVar2 != uVar14);
  puVar13 = scb->weights;
  bVar11 = false;
  auVar17 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
  iVar12 = 0;
  auVar5 = local_148;
  do {
    lVar15 = 0;
    do {
      auVar1 = *(undefined1 (*) [16])((long)local_78[0].m + lVar15);
      auVar19 = vpsubd_avx(*(undefined1 (*) [16])((long)local_b8[0].m + lVar15),auVar1);
      auVar19 = vpblendvb_avx(auVar19,(undefined1  [16])0x0,auVar5);
      auVar1 = vcvtdq2ps_avx(auVar1);
      *(undefined1 (*) [16])((long)afStack_f8 + lVar15) = auVar1;
      auVar1 = vcvtdq2ps_avx(auVar19);
      *(float *)((long)afStack_138 + lVar15) = auVar1._0_4_ * 0.015625;
      *(float *)((long)afStack_138 + lVar15 + 4) = auVar1._4_4_ * 0.015625;
      *(float *)((long)afStack_138 + lVar15 + 8) = auVar1._8_4_ * 0.015625;
      *(float *)((long)afStack_138 + lVar15 + 0xc) = auVar1._12_4_ * 0.015625;
      lVar15 = lVar15 + 0x10;
    } while ((ulong)bVar2 * 0x10 != lVar15);
    if (local_160->texel_count == '\0') {
      __assert_fail("bsd.texel_count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                    ,0x7d,
                    "bool realign_weights_undecimated(astcenc_profile, const block_size_descriptor &, const image_block &, symbolic_compressed_block &)"
                   );
    }
    if (local_160->texel_count != '\0') {
      uVar14 = 0;
      do {
        bVar3 = puVar13[uVar14];
        uVar4 = *(ushort *)(local_168 * 0xe2 + 0x330cb0 + (ulong)bVar3 * 2);
        fVar18 = (float)bVar3;
        fVar22 = (float)(int)((uint)(byte)uVar4 - (uint)bVar3);
        fVar28 = (float)(int)((uint)(uVar4 >> 8) - (uint)bVar3);
        uVar6 = (ulong)local_158->partition_of_texel[uVar14];
        fVar7 = afStack_138[uVar6 * 4];
        fVar8 = afStack_138[uVar6 * 4 + 1];
        fVar9 = afStack_138[uVar6 * 4 + 2];
        fVar10 = afStack_138[uVar6 * 4 + 3];
        auVar19._0_4_ = fVar7 * fVar18 + afStack_f8[uVar6 * 4];
        auVar19._4_4_ = fVar8 * fVar18 + *(float *)((long)local_b8[uVar6 - 4].m + 4);
        auVar19._8_4_ = fVar9 * fVar18 + *(float *)(local_b8[uVar6 - 4].m + 1);
        auVar19._12_4_ = fVar10 * fVar18 + *(float *)((long)local_b8[uVar6 - 4].m + 0xc);
        auVar1 = vinsertps_avx(ZEXT416((uint)blk->data_r[uVar14]),ZEXT416((uint)blk->data_g[uVar14])
                               ,0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)blk->data_b[uVar14]),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)blk->data_a[uVar14]),0x30);
        auVar19 = vsubps_avx(auVar19,auVar1);
        auVar1 = *(undefined1 (*) [16])(blk->channel_weight).m;
        fVar18 = auVar19._0_4_;
        fVar31 = auVar19._4_4_;
        fVar32 = auVar19._8_4_;
        fVar33 = auVar19._12_4_;
        fVar34 = auVar1._0_4_;
        auVar20._0_4_ = fVar34 * fVar18 * fVar18;
        fVar35 = auVar1._4_4_;
        auVar20._4_4_ = fVar35 * fVar31 * fVar31;
        fVar36 = auVar1._8_4_;
        auVar20._8_4_ = fVar36 * fVar32 * fVar32;
        fVar37 = auVar1._12_4_;
        auVar20._12_4_ = fVar37 * fVar33 * fVar33;
        auVar1 = vshufpd_avx(auVar20,auVar20,1);
        auVar21._0_4_ = auVar1._0_4_ + auVar20._0_4_;
        auVar21._4_4_ = auVar1._4_4_ + auVar20._4_4_;
        auVar21._8_4_ = auVar1._8_4_ + auVar20._8_4_;
        auVar21._12_4_ = auVar1._12_4_ + auVar20._12_4_;
        fVar23 = fVar7 * fVar22 + fVar18;
        fVar26 = fVar8 * fVar22 + fVar31;
        fVar27 = fVar9 * fVar22 + fVar32;
        fVar22 = fVar10 * fVar22 + fVar33;
        auVar1 = vhaddps_avx(auVar21,auVar21);
        auVar24._0_4_ = fVar34 * fVar23 * fVar23;
        auVar24._4_4_ = fVar35 * fVar26 * fVar26;
        auVar24._8_4_ = fVar36 * fVar27 * fVar27;
        auVar24._12_4_ = fVar37 * fVar22 * fVar22;
        auVar19 = vshufpd_avx(auVar24,auVar24,1);
        auVar25._0_4_ = auVar24._0_4_ + auVar19._0_4_;
        auVar25._4_4_ = auVar24._4_4_ + auVar19._4_4_;
        auVar25._8_4_ = auVar24._8_4_ + auVar19._8_4_;
        auVar25._12_4_ = auVar24._12_4_ + auVar19._12_4_;
        auVar19 = vhaddps_avx(auVar25,auVar25);
        fVar18 = fVar7 * fVar28 + fVar18;
        fVar31 = fVar8 * fVar28 + fVar31;
        fVar32 = fVar9 * fVar28 + fVar32;
        fVar33 = fVar10 * fVar28 + fVar33;
        auVar29._0_4_ = fVar34 * fVar18 * fVar18;
        auVar29._4_4_ = fVar35 * fVar31 * fVar31;
        auVar29._8_4_ = fVar36 * fVar32 * fVar32;
        auVar29._12_4_ = fVar37 * fVar33 * fVar33;
        auVar20 = vshufpd_avx(auVar29,auVar29,1);
        auVar30._0_4_ = auVar29._0_4_ + auVar20._0_4_;
        auVar30._4_4_ = auVar29._4_4_ + auVar20._4_4_;
        auVar30._8_4_ = auVar29._8_4_ + auVar20._8_4_;
        auVar30._12_4_ = auVar29._12_4_ + auVar20._12_4_;
        auVar20 = vhaddps_avx(auVar30,auVar30);
        if ((((auVar20._0_4_ < auVar1._0_4_) && (bVar3 < 0x40)) &&
            (uVar16 = (uint)(uVar4 >> 8), auVar20._0_4_ < auVar19._0_4_)) ||
           ((bVar3 != 0 && (uVar16 = (uint)uVar4, auVar19._0_4_ < auVar1._0_4_)))) {
          puVar13[uVar14] = (uint8_t)uVar16;
          bVar11 = true;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < local_160->texel_count);
    }
    puVar13 = puVar13 + 0x20;
    auVar5 = auVar5 ^ auVar17;
    iVar12 = iVar12 + 1;
  } while (iVar12 != local_170 + 1);
  return bVar11;
}

Assistant:

static bool realign_weights_undecimated(
	astcenc_profile decode_mode,
	const block_size_descriptor& bsd,
	const image_block& blk,
	symbolic_compressed_block& scb
) {
	// Get the partition descriptor
	unsigned int partition_count = scb.partition_count;
	const auto& pi = bsd.get_partition_info(partition_count, scb.partition_index);

	// Get the quantization table
	const block_mode& bm = bsd.get_block_mode(scb.block_mode);
	unsigned int weight_quant_level = bm.quant_mode;
	const quant_and_transfer_table& qat = quant_and_xfer_tables[weight_quant_level];

	unsigned int max_plane = bm.is_dual_plane;
	int plane2_component = scb.plane2_component;
	vmask4 plane_mask = vint4::lane_id() == vint4(plane2_component);

	// Decode the color endpoints
	bool rgb_hdr;
	bool alpha_hdr;
	vint4 endpnt0[BLOCK_MAX_PARTITIONS];
	vint4 endpnt1[BLOCK_MAX_PARTITIONS];
	vfloat4 endpnt0f[BLOCK_MAX_PARTITIONS];
	vfloat4 offset[BLOCK_MAX_PARTITIONS];

	promise(partition_count > 0);

	for (unsigned int pa_idx = 0; pa_idx < partition_count; pa_idx++)
	{
		unpack_color_endpoints(decode_mode,
		                       scb.color_formats[pa_idx],
		                       scb.color_values[pa_idx],
		                       rgb_hdr, alpha_hdr,
		                       endpnt0[pa_idx],
		                       endpnt1[pa_idx]);
	}

	uint8_t* dec_weights_uquant = scb.weights;
	bool adjustments = false;

	// For each plane and partition ...
	for (unsigned int pl_idx = 0; pl_idx <= max_plane; pl_idx++)
	{
		for (unsigned int pa_idx = 0; pa_idx < partition_count; pa_idx++)
		{
			// Compute the endpoint delta for all components in current plane
			vint4 epd = endpnt1[pa_idx] - endpnt0[pa_idx];
			epd = select(epd, vint4::zero(), plane_mask);

			endpnt0f[pa_idx] = int_to_float(endpnt0[pa_idx]);
			offset[pa_idx] = int_to_float(epd) * (1.0f / 64.0f);
		}

		// For each weight compute previous, current, and next errors
		promise(bsd.texel_count > 0);
		for (unsigned int texel = 0; texel < bsd.texel_count; texel++)
		{
			int uqw = dec_weights_uquant[texel];

			uint32_t prev_and_next = qat.prev_next_values[uqw];
			int uqw_down = prev_and_next & 0xFF;
			int uqw_up = (prev_and_next >> 8) & 0xFF;

			// Interpolate the colors to create the diffs
			float weight_base = static_cast<float>(uqw);
			float weight_down = static_cast<float>(uqw_down - uqw);
			float weight_up = static_cast<float>(uqw_up - uqw);

			unsigned int partition = pi.partition_of_texel[texel];
			vfloat4 color_offset = offset[partition];
			vfloat4 color_base   = endpnt0f[partition];

			vfloat4 color = color_base + color_offset * weight_base;
			vfloat4 orig_color   = blk.texel(texel);
			vfloat4 error_weight = blk.channel_weight;

			vfloat4 color_diff      = color - orig_color;
			vfloat4 color_diff_down = color_diff + color_offset * weight_down;
			vfloat4 color_diff_up   = color_diff + color_offset * weight_up;

			float error_base = dot_s(color_diff      * color_diff,      error_weight);
			float error_down = dot_s(color_diff_down * color_diff_down, error_weight);
			float error_up   = dot_s(color_diff_up   * color_diff_up,   error_weight);

			// Check if the prev or next error is better, and if so use it
			if ((error_up < error_base) && (error_up < error_down) && (uqw < 64))
			{
				dec_weights_uquant[texel] = static_cast<uint8_t>(uqw_up);
				adjustments = true;
			}
			else if ((error_down < error_base) && (uqw > 0))
			{
				dec_weights_uquant[texel] = static_cast<uint8_t>(uqw_down);
				adjustments = true;
			}
		}

		// Prepare iteration for plane 2
		dec_weights_uquant += WEIGHTS_PLANE2_OFFSET;
		plane_mask = ~plane_mask;
	}

	return adjustments;
}